

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O3

int amqp_simple_wait_frame_on_channel
              (amqp_connection_state_t state,amqp_channel_t channel,amqp_frame_t *decoded_frame)

{
  amqp_link_t **ppaVar1;
  undefined8 *puVar2;
  amqp_link_t_ *paVar3;
  undefined8 uVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  amqp_link_t *paVar10;
  amqp_time_t timeout_deadline;
  amqp_link_t *paVar11;
  
  ppaVar1 = &state->first_queued_frame;
  paVar10 = (amqp_link_t *)ppaVar1;
  do {
    paVar10 = paVar10->next;
    if (paVar10 == (amqp_link_t *)0x0) {
      while( true ) {
        timeout_deadline = amqp_time_infinite();
        iVar9 = wait_frame_inner(state,decoded_frame,timeout_deadline);
        if (iVar9 != 0) {
          return iVar9;
        }
        if (decoded_frame->channel == channel) break;
        paVar10 = amqp_create_link_for_frame(state,decoded_frame);
        if (paVar10 == (amqp_link_t *)0x0) {
          return -1;
        }
        paVar11 = (amqp_link_t *)ppaVar1;
        if (*ppaVar1 != (amqp_link_t *)0x0) {
          paVar11 = state->last_queued_frame;
        }
        paVar11->next = paVar10;
        paVar10->next = (amqp_link_t_ *)0x0;
        state->last_queued_frame = paVar10;
      }
      return 0;
    }
    puVar2 = (undefined8 *)paVar10->data;
  } while (*(amqp_channel_t *)((long)puVar2 + 2) != channel);
  paVar3 = paVar10->next;
  *ppaVar1 = paVar3;
  if (paVar3 == (amqp_link_t_ *)0x0) {
    state->last_queued_frame = (amqp_link_t *)0x0;
  }
  uVar4 = *puVar2;
  sVar5 = puVar2[1];
  pvVar6 = (void *)puVar2[2];
  pvVar7 = (void *)puVar2[3];
  pvVar8 = (void *)puVar2[5];
  (decoded_frame->payload).properties.raw.len = puVar2[4];
  (decoded_frame->payload).properties.raw.bytes = pvVar8;
  (decoded_frame->payload).method.decoded = pvVar6;
  (decoded_frame->payload).properties.decoded = pvVar7;
  decoded_frame->frame_type = (char)uVar4;
  decoded_frame->field_0x1 = (char)((ulong)uVar4 >> 8);
  decoded_frame->channel = (short)((ulong)uVar4 >> 0x10);
  *(int *)&decoded_frame->field_0x4 = (int)((ulong)uVar4 >> 0x20);
  (decoded_frame->payload).body_fragment.len = sVar5;
  return 0;
}

Assistant:

int amqp_simple_wait_frame_on_channel(amqp_connection_state_t state,
                                      amqp_channel_t channel,
                                      amqp_frame_t *decoded_frame) {
  amqp_frame_t *frame_ptr;
  amqp_link_t *cur;
  int res;

  for (cur = state->first_queued_frame; NULL != cur; cur = cur->next) {
    frame_ptr = cur->data;

    if (channel == frame_ptr->channel) {
      state->first_queued_frame = cur->next;
      if (NULL == state->first_queued_frame) {
        state->last_queued_frame = NULL;
      }

      *decoded_frame = *frame_ptr;

      return AMQP_STATUS_OK;
    }
  }

  for (;;) {
    res = wait_frame_inner(state, decoded_frame, amqp_time_infinite());

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (channel == decoded_frame->channel) {
      return AMQP_STATUS_OK;
    } else {
      res = amqp_queue_frame(state, decoded_frame);
      if (res != AMQP_STATUS_OK) {
        return res;
      }
    }
  }
}